

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

void __thiscall Potassco::AspifTextOutput::Data::convertToOutput(Data *this,StringMapNode node)

{
  undefined4 uVar1;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  *this_00;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
  *pvVar2;
  char *pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  ulong in_RSI;
  long in_RDI;
  Atom_t in_stack_0000003c;
  uint32_t data [4];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar6;
  uint *in_stack_ffffffffffffffd0;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  const_iterator in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RSI + 0x20) != 0) {
    this_00 = (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
               *)(ulong)*(uint *)(in_RSI + 0x20);
    pvVar2 = (vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
              *)std::
                vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                ::size((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                        *)(in_RDI + 0x50));
    if (this_00 < pvVar2) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
      if (*pcVar3 == '&') {
        uVar6 = *(uint *)(in_RSI + 0x20);
        uVar4 = std::__cxx11::string::c_str();
        fail(-2,"void Potassco::AspifTextOutput::Data::convertToOutput(StringMapNode)",0x149,
             "node->first[0] != \'&\'","Redefinition: theory atom \'%u\' already defined as \'%s\'",
             (ulong)uVar6,uVar4,0);
      }
      setGenName((Data *)data._0_8_,in_stack_0000003c);
      uVar7 = 4;
      sVar5 = std::
              vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
              ::size((vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                      *)(in_RDI + 0x68));
      uVar1 = (undefined4)sVar5;
      uVar8 = 1;
      uVar9 = *(undefined4 *)(in_RSI + 0x20);
      *(undefined4 *)(in_RSI + 0x20) = 0;
      std::
      vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
      ::push_back(this_00,(value_type *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff98);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_ffffffffffffff98);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int*,void>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar9,uVar8),
                 in_stack_ffffffffffffffe8,(uint *)CONCAT44(uVar1,uVar7),in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void convertToOutput(StringMapNode node) {
		if (node->second && node->second < atoms.size()) {
			POTASSCO_REQUIRE(node->first[0] != '&', "Redefinition: theory atom '%u' already defined as '%s'", node->second, node->first.c_str());
			setGenName(node->second);
			uint32_t data[4] = {static_cast<uint32_t>(Directive_t::Output), static_cast<uint32_t>(out.size()), 1, node->second};
			node->second = 0;
			out.push_back(node);
			directives.insert(directives.end(), data, data + 4);
		}
	}